

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O3

void __thiscall ExampleAppConsole::ExecCommand(ExampleAppConsole *this,char *command_line)

{
  uint uVar1;
  char **__src;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char **ppcVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  
  AddLog(this,"# %s\n",command_line);
  this->HistoryPos = -1;
  uVar8 = (ulong)(uint)(this->History).Size;
  do {
    if ((int)uVar8 < 1) goto LAB_00146ba8;
    if ((this->History).Size < (int)uVar8) goto LAB_00146d51;
    iVar2 = Stricmp((this->History).Data[uVar8 - 1],command_line);
    uVar8 = uVar8 - 1;
  } while (iVar2 != 0);
  iVar2 = (int)uVar8 + 1;
  if ((this->History).Size < iVar2) {
LAB_00146d51:
    __assert_fail("i < Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui.h"
                  ,0x52e,"T &ImVector<char *>::operator[](int) [T = char *]");
  }
  free((this->History).Data[uVar8]);
  uVar1 = (this->History).Size;
  if ((int)uVar1 < iVar2) {
    __assert_fail("it >= Data && it < Data+Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui.h"
                  ,0x546,"T *ImVector<char *>::erase(const T *) [T = char *]");
  }
  ppcVar5 = (this->History).Data;
  uVar8 = uVar8 & 0xffffffff;
  memmove(ppcVar5 + uVar8,ppcVar5 + uVar8 + 1,((ulong)uVar1 + ~uVar8) * 8);
  (this->History).Size = (this->History).Size + -1;
LAB_00146ba8:
  pcVar4 = Strdup(command_line);
  iVar2 = (this->History).Size;
  if (iVar2 == (this->History).Capacity) {
    if (iVar2 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar2 / 2 + iVar2;
    }
    iVar7 = iVar2 + 1;
    if (iVar2 + 1 < iVar6) {
      iVar7 = iVar6;
    }
    ppcVar5 = (char **)ImGui::MemAlloc((long)iVar7 << 3);
    __src = (this->History).Data;
    if (__src != (char **)0x0) {
      memcpy(ppcVar5,__src,(long)(this->History).Size << 3);
      ImGui::MemFree((this->History).Data);
    }
    (this->History).Data = ppcVar5;
    (this->History).Capacity = iVar7;
    iVar2 = (this->History).Size;
  }
  else {
    ppcVar5 = (this->History).Data;
  }
  ppcVar5[iVar2] = pcVar4;
  (this->History).Size = (this->History).Size + 1;
  iVar2 = Stricmp(command_line,"CLEAR");
  if (iVar2 == 0) {
    ClearLog(this);
  }
  else {
    iVar2 = Stricmp(command_line,"HELP");
    if (iVar2 == 0) {
      AddLog(this,"Commands:");
      if (0 < (this->Commands).Size) {
        lVar9 = 0;
        do {
          AddLog(this,"- %s",(this->Commands).Data[lVar9]);
          lVar9 = lVar9 + 1;
        } while (lVar9 < (this->Commands).Size);
      }
    }
    else {
      iVar2 = Stricmp(command_line,"HISTORY");
      if (iVar2 == 0) {
        uVar1 = (this->History).Size;
        uVar3 = 10;
        if (10 < (int)uVar1) {
          uVar3 = uVar1;
        }
        if ((int)(uVar3 - 10) < (int)uVar1) {
          uVar8 = (ulong)uVar3 - 10;
          do {
            AddLog(this,"%3d: %s\n",uVar8 & 0xffffffff,(this->History).Data[uVar8]);
            uVar8 = uVar8 + 1;
          } while ((long)uVar8 < (long)(this->History).Size);
        }
      }
      else {
        AddLog(this,"Unknown command: \'%s\'\n",command_line);
      }
    }
  }
  this->ScrollToBottom = true;
  return;
}

Assistant:

void    ExecCommand(const char* command_line)
    {
        AddLog("# %s\n", command_line);

        // Insert into history. First find match and delete it so it can be pushed to the back.
        // This isn't trying to be smart or optimal.
        HistoryPos = -1;
        for (int i = History.Size-1; i >= 0; i--)
            if (Stricmp(History[i], command_line) == 0)
            {
                free(History[i]);
                History.erase(History.begin() + i);
                break;
            }
        History.push_back(Strdup(command_line));

        // Process command
        if (Stricmp(command_line, "CLEAR") == 0)
        {
            ClearLog();
        }
        else if (Stricmp(command_line, "HELP") == 0)
        {
            AddLog("Commands:");
            for (int i = 0; i < Commands.Size; i++)
                AddLog("- %s", Commands[i]);
        }
        else if (Stricmp(command_line, "HISTORY") == 0)
        {
            int first = History.Size - 10;
            for (int i = first > 0 ? first : 0; i < History.Size; i++)
                AddLog("%3d: %s\n", i, History[i]);
        }
        else
        {
            AddLog("Unknown command: '%s'\n", command_line);
        }

        // On command input, we scroll to bottom even if AutoScroll==false
        ScrollToBottom = true;
    }